

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolui.c
# Opt level: O0

int ffu2fr8(unsigned_short *input,long ntodo,double scale,double zero,double *output,int *status)

{
  long ii;
  int *status_local;
  double *output_local;
  double zero_local;
  double scale_local;
  long ntodo_local;
  unsigned_short *input_local;
  
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    for (ii = 0; ii < ntodo; ii = ii + 1) {
      output[ii] = ((double)input[ii] - zero) / scale;
    }
  }
  else {
    for (ii = 0; ii < ntodo; ii = ii + 1) {
      output[ii] = (double)input[ii];
    }
  }
  return *status;
}

Assistant:

int ffu2fr8(unsigned short *input, /* I - array of values to be converted */
            long ntodo,        /* I - number of elements in the array  */
            double scale,      /* I - FITS TSCALn or BSCALE value      */
            double zero,       /* I - FITS TZEROn or BZERO  value      */
            double *output,    /* O - output array of converted values */
            int *status)       /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required.
*/
{
    long ii;

    if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
                output[ii] = (double) input[ii];
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
            output[ii] = ((double) input[ii] - zero) / scale;
    }
    return(*status);
}